

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

void httplib::detail::get_remote_ip_and_port(socket_t sock,string *ip,int *port)

{
  char *pcVar1;
  socklen_t __salen;
  int iVar2;
  socklen_t addr_len;
  socklen_t len;
  sockaddr_storage addr;
  ucred ucred;
  socklen_t local_4b0 [2];
  sockaddr local_4a8 [8];
  int local_424 [257];
  
  local_4b0[0] = 0x80;
  iVar2 = getpeername(sock,local_4a8,local_4b0);
  __salen = local_4b0[0];
  if (iVar2 == 0) {
    if ((local_4a8[0].sa_family == 10) || (local_4a8[0].sa_family == 2)) {
      *port = (uint)(ushort)(local_4a8[0].sa_data._0_2_ << 8 |
                            (ushort)local_4a8[0].sa_data._0_2_ >> 8);
      memset(local_424,0,0x401);
      iVar2 = getnameinfo(local_4a8,__salen,(char *)local_424,0x401,(char *)0x0,0,1);
      if (iVar2 == 0) {
        pcVar1 = (char *)ip->_M_string_length;
        strlen((char *)local_424);
        std::__cxx11::string::_M_replace((ulong)ip,0,pcVar1,(ulong)local_424);
      }
    }
    else if (local_4a8[0].sa_family == 1) {
      local_4b0[1] = 0xc;
      iVar2 = getsockopt(sock,1,0x11,local_424,local_4b0 + 1);
      if (iVar2 == 0) {
        *port = local_424[0];
      }
    }
  }
  return;
}

Assistant:

inline void get_remote_ip_and_port(socket_t sock, std::string &ip, int &port) {
  struct sockaddr_storage addr;
  socklen_t addr_len = sizeof(addr);

  if (!getpeername(sock, reinterpret_cast<struct sockaddr *>(&addr),
                   &addr_len)) {
#ifndef _WIN32
    if (addr.ss_family == AF_UNIX) {
#if defined(__linux__)
      struct ucred ucred;
      socklen_t len = sizeof(ucred);
      if (getsockopt(sock, SOL_SOCKET, SO_PEERCRED, &ucred, &len) == 0) {
        port = ucred.pid;
      }
#elif defined(SOL_LOCAL) && defined(SO_PEERPID) // __APPLE__
      pid_t pid;
      socklen_t len = sizeof(pid);
      if (getsockopt(sock, SOL_LOCAL, SO_PEERPID, &pid, &len) == 0) {
        port = pid;
      }
#endif
      return;
    }
#endif
    get_ip_and_port(addr, addr_len, ip, port);
  }
}